

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_error_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSAtomStruct **ppJVar2;
  JSValueUnion JVar3;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  JSRefCountHeader *p_1;
  ulong uVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  
  if ((int)this_val.tag == -1) {
    JVar8 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
    if ((int)JVar8.tag == 3) {
      ppJVar2 = ctx->rt->atom_array;
      JVar4 = (JSValueUnion)((JSValueUnion *)(ppJVar2 + 0x91))->ptr;
      if (((uint)((ulong)*(undefined8 *)((long)JVar4.ptr + 4) >> 0x3e) != 1) &&
         ((int)*(undefined8 *)((long)JVar4.ptr + 4) == -0x80000000)) {
        JVar4 = (JSValueUnion)((JSValueUnion *)(ppJVar2 + 0x2f))->ptr;
      }
      *(int *)JVar4.ptr = *JVar4.ptr + 1;
      JVar8.tag = -7;
      JVar8.u.ptr = JVar4.ptr;
    }
    else {
      JVar8 = JS_ToStringFree(ctx,JVar8);
    }
    JVar4 = JVar8.u;
    if ((JVar8.tag & 0xffffffffU) != 6) {
      JVar10 = JS_GetPropertyInternal(ctx,this_val,0x33,this_val,0);
      if ((int)JVar10.tag == 3) {
        JVar3 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
        *(int *)JVar3.ptr = *JVar3.ptr + 1;
        JVar10.tag = -7;
        JVar10.u.ptr = JVar3.ptr;
      }
      else {
        JVar10 = JS_ToStringFree(ctx,JVar10);
      }
      if ((JVar10.tag & 0xffffffffU) != 6) {
        if ((((uint)JVar8.tag != 0xfffffff9) || ((*(uint *)((long)JVar4.ptr + 4) & 0x7fffffff) != 0)
            ) && (((int)JVar10.tag != -7 || ((*(uint *)((long)JVar10.u.ptr + 4) & 0x7fffffff) != 0))
                 )) {
          JVar8 = JS_ConcatString3(ctx,"",JVar8,": ");
        }
        JVar8 = JS_ConcatString(ctx,JVar8,JVar10);
        iVar6 = JVar8.tag;
        uVar5 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar7 = (ulong)JVar8.u._0_4_;
        goto LAB_0015e940;
      }
      if ((0xfffffff4 < (uint)JVar8.tag) &&
         (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
  }
  uVar7 = 0;
  iVar6 = 6;
  uVar5 = 0;
LAB_0015e940:
  JVar9.tag = iVar6;
  JVar9.u.ptr = (void *)(uVar7 | uVar5);
  return JVar9;
}

Assistant:

static JSValue js_error_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue name, msg;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsUndefined(name))
        name = JS_AtomToString(ctx, JS_ATOM_Error);
    else
        name = JS_ToStringFree(ctx, name);
    if (JS_IsException(name))
        return JS_EXCEPTION;

    msg = JS_GetProperty(ctx, this_val, JS_ATOM_message);
    if (JS_IsUndefined(msg))
        msg = JS_AtomToString(ctx, JS_ATOM_empty_string);
    else
        msg = JS_ToStringFree(ctx, msg);
    if (JS_IsException(msg)) {
        JS_FreeValue(ctx, name);
        return JS_EXCEPTION;
    }
    if (!JS_IsEmptyString(name) && !JS_IsEmptyString(msg))
        name = JS_ConcatString3(ctx, "", name, ": ");
    return JS_ConcatString(ctx, name, msg);
}